

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptReflect.cpp
# Opt level: O2

Var Js::JavascriptReflect::EntryGetPrototypeOf(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  RecyclableObject *obj;
  int32 hCode;
  int in_stack_00000010;
  undefined1 local_70 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x92,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bacdce;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&callInfo_local,(CallInfo *)&__tag.entry.next,(Var *)&stack0x00000018
            );
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_70,function,(CallInfo)__tag.entry.next,
             L"Reflect.getPrototypeOf",&stack0x00000000);
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x96,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar3) {
LAB_00bacdce:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (((uint)callInfo_local._0_4_ >> 0x18 & 1) == 0) {
    hCode = -0x7ff5ec36;
    if ((callInfo_local._0_4_ & 0xfffffe) != 0) {
      pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      BVar4 = JavascriptOperators::IsObject(pvVar6);
      if (BVar4 != 0) {
        pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
        obj = VarTo<Js::RecyclableObject>(pvVar6);
        pvVar6 = JavascriptObject::GetPrototypeOf(obj,pSVar1);
        AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_70)
        ;
        return pvVar6;
      }
    }
  }
  else {
    hCode = -0x7ff5ebf5;
  }
  JavascriptError::ThrowTypeError(pSVar1,hCode,L"Reflect.getPrototypeOf");
}

Assistant:

Var JavascriptReflect::EntryGetPrototypeOf(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Reflect.getPrototypeOf"));

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if  (args.Info.Flags & CallFlags_New)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ErrorOnNew, _u("Reflect.getPrototypeOf"));
        }

        if (args.Info.Count < 2 || !JavascriptOperators::IsObject(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("Reflect.getPrototypeOf"));
        }
        Var target = args[1];
        return JavascriptObject::GetPrototypeOf(VarTo<RecyclableObject>(target), scriptContext);
    }